

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

int Wln_RetCheckForward(Wln_Ret_t *p,Vec_Int_t *vSet)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Wln_Ntk_t *pWVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  if (0 < (long)vSet->nSize) {
    pWVar6 = p->pNtk;
    lVar11 = 0;
    do {
      iVar1 = vSet->pArray[lVar11];
      uVar2 = pWVar6->vFanins[iVar1].nSize;
      if (0 < (int)uVar2) {
        if ((iVar1 < 0) || (iVar10 = (p->vFanins).nSize, iVar10 <= iVar1)) {
LAB_00388730:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar7 = (p->vFanins).pArray;
        uVar3 = piVar7[iVar1];
        if (((int)uVar3 < 0) || (iVar10 <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar10 = -1;
        uVar12 = 0;
        do {
          iVar4 = piVar7[(ulong)uVar3 + uVar12 * 2];
          lVar9 = (long)iVar4;
          if (lVar9 != 0) {
            if (pWVar6->vFanins[lVar9].nSize == 0) {
              if ((iVar4 < 0) || ((pWVar6->vTypes).nSize <= iVar4)) goto LAB_00388730;
              if ((pWVar6->vTypes).pArray[lVar9] != 3) goto LAB_00388704;
            }
            iVar4 = (pWVar6->vTypes).nSize;
            if (iVar4 <= iVar1) goto LAB_00388730;
            piVar8 = (pWVar6->vTypes).pArray;
            if ((uVar12 == 0) || (piVar8[iVar1] != 0x59)) {
              iVar5 = piVar7[(ulong)uVar3 + uVar12 * 2 + 1];
              if (iVar5 == 0) {
                return 0;
              }
              if ((iVar5 < -1) || ((p->vEdgeLinks).nSize <= (int)(iVar5 + 1U))) goto LAB_00388730;
              iVar5 = (p->vEdgeLinks).pArray[iVar5 + 1U];
              lVar9 = (long)iVar5;
              if ((lVar9 < 0) || (iVar4 <= iVar5)) goto LAB_00388730;
              if (piVar8[lVar9] != 0x59) {
                __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnRetime.c"
                              ,0x16f,"int Wln_RetCheckForwardOne(Wln_Ret_t *, int)");
              }
              iVar4 = (p->vFfClasses).nSize;
              if (iVar10 == -1) {
                if (iVar4 <= iVar5) goto LAB_00388730;
                iVar10 = (p->vFfClasses).pArray[lVar9];
              }
              else {
                if (iVar4 <= iVar5) goto LAB_00388730;
                if (iVar10 != (p->vFfClasses).pArray[lVar9]) {
                  return 0;
                }
              }
            }
          }
LAB_00388704:
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != vSet->nSize);
  }
  return 1;
}

Assistant:

int Wln_RetCheckForward( Wln_Ret_t * p, Vec_Int_t * vSet )
{
    int i, iObj;
    Vec_IntForEachEntry( vSet, iObj, i )
        if ( !Wln_RetCheckForwardOne( p, iObj ) )
            return 0;
    return 1;
}